

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

const_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::operator++
          (const_iterator *this)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  const_iterator *in_RDI;
  uint32_t in_stack_0000003c;
  Path *in_stack_00000040;
  
  puVar4 = IntervalMapDetails::Path::leafOffset((Path *)0x983193);
  uVar1 = *puVar4;
  *puVar4 = uVar1 + 1;
  uVar3 = IntervalMapDetails::Path::leafSize((Path *)0x9831ac);
  if (uVar1 + 1 == uVar3) {
    bVar2 = isFlat(in_RDI);
    if (!bVar2) {
      IntervalMapDetails::Path::moveRight(in_stack_00000040,in_stack_0000003c);
    }
  }
  return in_RDI;
}

Assistant:

const_iterator& operator++() {
        SLANG_ASSERT(valid());
        if (++path.leafOffset() == path.leafSize() && !isFlat())
            path.moveRight(map->height);
        return *this;
    }